

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

bool is_col_taken(vector<bool,_std::allocator<bool>_> *col_is_taken,
                 robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *col_is_taken_s,size_t col_num)

{
  bool bVar1;
  iterator lhs;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffffb8;
  _Bit_type *local_30;
  _Bit_type *__n;
  bool local_1;
  
  __n = local_30;
  bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(unaff_retaddr);
  if (bVar1) {
    tsl::
    robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::find(in_stack_ffffffffffffffb8,(unsigned_long *)0x1a9d3b);
    lhs = tsl::
          robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::end(in_stack_ffffffffffffffb8);
    local_1 = tsl::detail_robin_hash::operator!=
                        ((robin_iterator<false> *)lhs.m_bucket,
                         (robin_iterator<false> *)in_stack_ffffffffffffffb8);
  }
  else {
    _local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,(size_type)__n);
    local_1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_30);
  }
  return local_1;
}

Assistant:

bool is_col_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                  size_t col_num)
{
    if (!col_is_taken.empty())
        return col_is_taken[col_num];
    else
        return col_is_taken_s.find(col_num) != col_is_taken_s.end();
}